

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.h
# Opt level: O0

Scalar * __thiscall
Eigen::SparseMatrix<double,_0,_int>::insertUncompressed
          (SparseMatrix<double,_0,_int> *this,Index row,Index col)

{
  bool bVar1;
  long lVar2;
  int *piVar3;
  char *pcVar4;
  StorageIndex *pSVar5;
  Scalar *pSVar6;
  int extraout_EDX;
  int __c;
  int iVar7;
  long in_RDX;
  long lVar8;
  long extraout_RDX;
  long in_RDI;
  Index p;
  Index startId;
  StorageIndex innerNNZ;
  Index room;
  StorageIndex inner;
  Index outer;
  undefined4 in_stack_ffffffffffffff80;
  StorageIndex SVar9;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 uVar10;
  SingletonVector *in_stack_ffffffffffffff88;
  Scalar SVar11;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  char *local_58;
  int local_40 [3];
  int local_34;
  long local_30;
  StorageIndex local_24;
  long local_20;
  
  local_20 = in_RDX;
  local_24 = SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_>::convert_index(0x1ddf9a);
  local_30 = (long)(*(int *)(*(long *)(in_RDI + 0x18) + 4 + local_20 * 4) -
                   *(int *)(*(long *)(in_RDI + 0x18) + local_20 * 4));
  local_34 = *(int *)(*(long *)(in_RDI + 0x20) + local_20 * 4);
  if (local_30 <= local_34) {
    local_40[0] = 2;
    std::max<int>(local_40,&local_34);
    SingletonVector::SingletonVector
              ((SingletonVector *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               (Index)in_stack_ffffffffffffff88,
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
    SparseMatrix<double,0,int>::reserve<Eigen::SparseMatrix<double,0,int>::SingletonVector>
              ((SparseMatrix<double,_0,_int> *)
               CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,
               (value_type *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  }
  lVar2 = (long)*(int *)(*(long *)(in_RDI + 0x18) + local_20 * 4);
  local_58 = (char *)(lVar2 + *(int *)(*(long *)(in_RDI + 0x20) + local_20 * 4));
  lVar8 = local_20;
  while( true ) {
    iVar7 = (int)lVar8;
    bVar1 = false;
    if (lVar2 < (long)local_58) {
      piVar3 = (int *)internal::CompressedStorage<double,_int>::index
                                ((CompressedStorage<double,_int> *)(in_RDI + 0x28),local_58 + -1,
                                 iVar7);
      bVar1 = local_24 < *piVar3;
      iVar7 = extraout_EDX;
    }
    if (!bVar1) break;
    pcVar4 = internal::CompressedStorage<double,_int>::index
                       ((CompressedStorage<double,_int> *)(in_RDI + 0x28),local_58 + -1,iVar7);
    uVar10 = *(undefined4 *)pcVar4;
    pcVar4 = internal::CompressedStorage<double,_int>::index
                       ((CompressedStorage<double,_int> *)(in_RDI + 0x28),local_58,__c);
    *(undefined4 *)pcVar4 = uVar10;
    pSVar6 = internal::CompressedStorage<double,_int>::value
                       ((CompressedStorage<double,_int> *)(in_RDI + 0x28),(Index)(local_58 + -1));
    SVar11 = *pSVar6;
    pSVar6 = internal::CompressedStorage<double,_int>::value
                       ((CompressedStorage<double,_int> *)(in_RDI + 0x28),(Index)local_58);
    *pSVar6 = SVar11;
    local_58 = local_58 + -1;
    lVar8 = extraout_RDX;
  }
  iVar7 = *(int *)(*(long *)(in_RDI + 0x20) + local_20 * 4) + 1;
  *(int *)(*(long *)(in_RDI + 0x20) + local_20 * 4) = iVar7;
  SVar9 = local_24;
  pSVar5 = (StorageIndex *)
           internal::CompressedStorage<double,_int>::index
                     ((CompressedStorage<double,_int> *)(in_RDI + 0x28),local_58,iVar7);
  *pSVar5 = SVar9;
  pSVar6 = internal::CompressedStorage<double,_int>::value
                     ((CompressedStorage<double,_int> *)(in_RDI + 0x28),(Index)local_58);
  *pSVar6 = 0.0;
  return pSVar6;
}

Assistant:

EIGEN_DONT_INLINE typename SparseMatrix<_Scalar,_Options,_StorageIndex>::Scalar& SparseMatrix<_Scalar,_Options,_StorageIndex>::insertUncompressed(Index row, Index col)
{
  eigen_assert(!isCompressed());

  const Index outer = IsRowMajor ? row : col;
  const StorageIndex inner = convert_index(IsRowMajor ? col : row);

  Index room = m_outerIndex[outer+1] - m_outerIndex[outer];
  StorageIndex innerNNZ = m_innerNonZeros[outer];
  if(innerNNZ>=room)
  {
    // this inner vector is full, we need to reallocate the whole buffer :(
    reserve(SingletonVector(outer,std::max<StorageIndex>(2,innerNNZ)));
  }

  Index startId = m_outerIndex[outer];
  Index p = startId + m_innerNonZeros[outer];
  while ( (p > startId) && (m_data.index(p-1) > inner) )
  {
    m_data.index(p) = m_data.index(p-1);
    m_data.value(p) = m_data.value(p-1);
    --p;
  }
  eigen_assert((p<=startId || m_data.index(p-1)!=inner) && "you cannot insert an element that already exists, you must call coeffRef to this end");

  m_innerNonZeros[outer]++;

  m_data.index(p) = inner;
  return (m_data.value(p) = Scalar(0));
}